

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.h
# Opt level: O0

GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
* __thiscall
rapidjson::
GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
::operator=(GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
            *this,GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                  *rhs)

{
  Ch *pCVar1;
  SizeType SVar2;
  Ch *pCVar3;
  GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
  *rhs_local;
  GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
  *this_local;
  
  if (this != rhs) {
    Free(this);
    SVar2 = GetStringLength(rhs);
    Allocate(this,(ulong)SVar2);
    pCVar3 = this->scheme_;
    pCVar1 = rhs->scheme_;
    SVar2 = GetSchemeStringLength(rhs);
    pCVar3 = CopyPart(this,pCVar3,pCVar1,(ulong)SVar2);
    this->auth_ = pCVar3;
    pCVar3 = this->auth_;
    pCVar1 = rhs->auth_;
    SVar2 = GetAuthStringLength(rhs);
    pCVar3 = CopyPart(this,pCVar3,pCVar1,(ulong)SVar2);
    this->path_ = pCVar3;
    pCVar3 = this->path_;
    pCVar1 = rhs->path_;
    SVar2 = GetPathStringLength(rhs);
    pCVar3 = CopyPart(this,pCVar3,pCVar1,(ulong)SVar2);
    this->query_ = pCVar3;
    pCVar3 = this->query_;
    pCVar1 = rhs->query_;
    SVar2 = GetQueryStringLength(rhs);
    pCVar3 = CopyPart(this,pCVar3,pCVar1,(ulong)SVar2);
    this->frag_ = pCVar3;
    pCVar3 = this->frag_;
    pCVar1 = rhs->frag_;
    SVar2 = GetFragStringLength(rhs);
    pCVar3 = CopyPart(this,pCVar3,pCVar1,(ulong)SVar2);
    this->base_ = pCVar3;
    pCVar3 = this->base_;
    pCVar1 = rhs->base_;
    SVar2 = GetBaseStringLength(rhs);
    pCVar3 = CopyPart(this,pCVar3,pCVar1,(ulong)SVar2);
    this->uri_ = pCVar3;
    pCVar3 = this->uri_;
    pCVar1 = rhs->uri_;
    SVar2 = GetStringLength(rhs);
    CopyPart(this,pCVar3,pCVar1,(ulong)SVar2);
  }
  return this;
}

Assistant:

GenericUri& operator=(const GenericUri& rhs) {
        if (this != &rhs) {
            // Do not delete ownAllocator
            Free();
            Allocate(rhs.GetStringLength());
            auth_ = CopyPart(scheme_, rhs.scheme_, rhs.GetSchemeStringLength());
            path_ = CopyPart(auth_, rhs.auth_, rhs.GetAuthStringLength());
            query_ = CopyPart(path_, rhs.path_, rhs.GetPathStringLength());
            frag_ = CopyPart(query_, rhs.query_, rhs.GetQueryStringLength());
            base_ = CopyPart(frag_, rhs.frag_, rhs.GetFragStringLength());
            uri_ = CopyPart(base_, rhs.base_, rhs.GetBaseStringLength());
            CopyPart(uri_, rhs.uri_, rhs.GetStringLength());
        }
        return *this;
    }